

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::Formatter::ToString<int,void>
          (string *__return_storage_ptr__,Formatter *this,int x)

{
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  AlphaNum local_48;
  int local_14;
  string *psStack_10;
  int x_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  strings::AlphaNum::AlphaNum(&local_48,local_14);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_48,
                    (AlphaNum *)CONCAT44(extraout_var,extraout_EDX));
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(I x) {
    return StrCat(x);
  }